

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

void __thiscall
miniros::MasterLink::setParamImpl<int>
          (MasterLink *this,string *key,vector<int,_std::allocator<int>_> *vec)

{
  XmlRpcValue *this_00;
  long lVar1;
  ulong uVar2;
  pointer piVar3;
  RpcValue xml_vec;
  XmlRpcValue local_48;
  string *local_38;
  
  local_48._type = TypeInvalid;
  local_48._value.asDouble = 0.0;
  local_38 = key;
  XmlRpc::XmlRpcValue::assertArray
            (&local_48,
             (int)((ulong)((long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 2));
  piVar3 = (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar3) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      this_00 = XmlRpc::XmlRpcValue::operator[](&local_48,(int)uVar2);
      XmlRpc::XmlRpcValue::operator=(this_00,(int *)((long)piVar3 + lVar1));
      uVar2 = uVar2 + 1;
      piVar3 = (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      lVar1 = lVar1 + 4;
    } while (uVar2 < (ulong)((long)(vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar3 >> 2));
  }
  set(this,local_38,&local_48);
  XmlRpc::XmlRpcValue::invalidate(&local_48);
  return;
}

Assistant:

void MasterLink::setParamImpl(const std::string& key, const std::vector<T>& vec)
{
  // Note: the XmlRpcValue starts off as "invalid" and assertArray turns it
  // into an array type with the given size
  RpcValue xml_vec;
  xml_vec.setSize(vec.size());

  // Copy the contents into the XmlRpcValue
  for (size_t i = 0; i < vec.size(); i++) {
    xml_vec[i] = vec.at(i);
  }

  this->set(key, xml_vec);
}